

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O0

int jpc_cox_getcompparms
              (jpc_ms_t *ms,jpc_cstate_t *cstate,jas_stream_t *in,int prtflag,jpc_coxcp_t *compparms
              )

{
  int iVar1;
  int local_40;
  byte local_39;
  int i;
  uint_fast8_t tmp;
  jpc_coxcp_t *compparms_local;
  jas_stream_t *pjStack_28;
  int prtflag_local;
  jas_stream_t *in_local;
  jpc_cstate_t *cstate_local;
  jpc_ms_t *ms_local;
  
  _i = compparms;
  compparms_local._4_4_ = prtflag;
  pjStack_28 = in;
  in_local = (jas_stream_t *)cstate;
  cstate_local = (jpc_cstate_t *)ms;
  iVar1 = jpc_getuint8(in,&compparms->numdlvls);
  if ((((iVar1 == 0) && (iVar1 = jpc_getuint8(pjStack_28,&_i->cblkwidthval), iVar1 == 0)) &&
      (iVar1 = jpc_getuint8(pjStack_28,&_i->cblkheightval), iVar1 == 0)) &&
     ((iVar1 = jpc_getuint8(pjStack_28,&_i->cblksty), iVar1 == 0 &&
      (iVar1 = jpc_getuint8(pjStack_28,&_i->qmfbid), iVar1 == 0)))) {
    if (((_i->numdlvls < 0x21) && ((_i->qmfbid == '\0' || (_i->qmfbid == '\x01')))) &&
       (_i->numrlvls = _i->numdlvls + 1, _i->numrlvls < 0x22)) {
      if (compparms_local._4_4_ != 0) {
        for (local_40 = 0; local_40 < _i->numrlvls; local_40 = local_40 + 1) {
          iVar1 = jpc_getuint8(pjStack_28,&local_39);
          if (iVar1 != 0) goto LAB_001294a2;
          _i->rlvls[local_40].parwidthval = local_39 & 0xf;
          _i->rlvls[local_40].parheightval = (uint_fast8_t)((int)(uint)local_39 >> 4);
        }
        _i->csty = _i->csty | 1;
      }
      if ((pjStack_28->flags_ & 1U) == 0) {
        return 0;
      }
    }
LAB_001294a2:
    jpc_cox_destroycompparms(_i);
  }
  return -1;
}

Assistant:

static int jpc_cox_getcompparms(jpc_ms_t *ms, jpc_cstate_t *cstate,
  jas_stream_t *in, int prtflag, jpc_coxcp_t *compparms)
{
	uint_fast8_t tmp;
	int i;

	/* Eliminate compiler warning about unused variables. */
	(void)ms;
	(void)cstate;

	if (jpc_getuint8(in, &compparms->numdlvls) ||
	  jpc_getuint8(in, &compparms->cblkwidthval) ||
	  jpc_getuint8(in, &compparms->cblkheightval) ||
	  jpc_getuint8(in, &compparms->cblksty) ||
	  jpc_getuint8(in, &compparms->qmfbid)) {
		return -1;
	}
	if (compparms->numdlvls > 32) {
		goto error;
	}
	if (compparms->qmfbid != JPC_COX_INS &&
	    compparms->qmfbid != JPC_COX_RFT)
		goto error;
	compparms->numrlvls = compparms->numdlvls + 1;
	if (compparms->numrlvls > JPC_MAXRLVLS) {
		goto error;
	}
	if (prtflag) {
		for (i = 0; i < compparms->numrlvls; ++i) {
			if (jpc_getuint8(in, &tmp)) {
				goto error;
			}
			compparms->rlvls[i].parwidthval = tmp & 0xf;
			compparms->rlvls[i].parheightval = (tmp >> 4) & 0xf;
		}
		/* Sigh.
		This bit should be in the same field in both COC and COD mrk segs. */
		compparms->csty |= JPC_COX_PRT;
	}
	if (jas_stream_eof(in)) {
		goto error;
	}
	return 0;
error:
	jpc_cox_destroycompparms(compparms);
	return -1;
}